

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O3

char * int2str::impl::detail<10000ull>::convert<char*>(number_t x,char *iter)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  
  if (x < 10000) {
    if (x < 1000) {
      if (x < 100) {
        lVar4 = 1;
        if (9 < x) {
          uVar7 = ((uint)x & 0xff) / 10;
          iter[1] = (char)x + (char)uVar7 * -10 + '0';
          lVar4 = 2;
          x = (number_t)uVar7;
        }
        pcVar5 = iter + lVar4;
        *iter = (byte)x | 0x30;
      }
      else {
        uVar7 = (uint)((x & 0xffff) >> 2) / 0x19;
        *iter = (byte)uVar7 | 0x30;
        uVar8 = (ulong)uVar7 * -100 + x;
        if (uVar8 < 10) {
          bVar6 = (byte)uVar8 | 0x30;
          cVar3 = '0';
        }
        else {
          cVar1 = (char)(uVar8 / 10);
          cVar3 = cVar1 + '0';
          bVar6 = (byte)uVar8 + cVar1 * -10 + 0x30;
        }
        iter[1] = cVar3;
        iter[2] = bVar6;
        pcVar5 = iter + 3;
      }
    }
    else {
      uVar7 = (uint)((x & 0xffff) >> 3) / 0x7d;
      *iter = (char)uVar7 + '0';
      uVar8 = (ulong)uVar7 * -1000 + x;
      if (uVar8 < 100) {
        iter[1] = '0';
        if (uVar8 < 10) {
          bVar6 = (byte)uVar8 | 0x30;
          bVar2 = 0x30;
        }
        else {
          bVar6 = (byte)(((uint)uVar8 & 0xff) / 10);
          bVar2 = bVar6 | 0x30;
          bVar6 = (byte)uVar8 + bVar6 * -10 + 0x30;
        }
        iter[2] = bVar2;
      }
      else {
        iter[1] = (char)(uVar8 / 100) + '0';
        uVar8 = uVar8 % 100;
        if (uVar8 < 10) {
          bVar6 = (byte)uVar8 | 0x30;
          cVar3 = '0';
        }
        else {
          cVar1 = (char)(uVar8 / 10);
          cVar3 = cVar1 + '0';
          bVar6 = (byte)uVar8 + cVar1 * -10 + 0x30;
        }
        iter[2] = cVar3;
      }
      iter[3] = bVar6;
      pcVar5 = iter + 4;
    }
    return pcVar5;
  }
  pcVar5 = convert_step<char*>(x,iter);
  return pcVar5;
}

Assistant:

inline static Iter convert(number_t x, Iter iter)
    {
        if (N > x)
            return detail<N / 10u>::convert(x, iter);
        return detail<N>::convert_step(x, iter);
    }